

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O1

void __thiscall
icu_63::VTimeZone::writeZone
          (VTimeZone *this,VTZWriter *w,BasicTimeZone *basictz,UVector *customProps,
          UErrorCode *status)

{
  short sVar1;
  UErrorCode UVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  UBool UVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  int32_t iVar10;
  int32_t iVar11;
  uint uVar12;
  int iVar13;
  UnicodeString *src;
  TimeZoneRule *pTVar14;
  VTimeZone *pVVar15;
  VTimeZone *pVVar16;
  VTimeZone *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DateTimeRule *pDVar17;
  undefined4 uVar18;
  undefined8 uVar19;
  UErrorCode *status_00;
  int iVar20;
  int iVar21;
  int iVar22;
  UDate UVar23;
  int local_260;
  int local_25c;
  int local_248;
  int local_244;
  VTimeZone *local_240;
  VTimeZone *local_238;
  int32_t month;
  int32_t year;
  UErrorCode *local_228;
  int32_t local_220;
  int32_t local_21c;
  int32_t mid;
  int32_t dow;
  UDate local_210;
  UDate local_208;
  ulong local_200;
  ulong local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  UDate local_1c0;
  UDate local_1b8;
  UDate local_1b0;
  int local_1a8;
  int32_t local_1a4;
  int32_t local_1a0;
  int32_t local_19c;
  VTimeZone *local_198;
  int32_t dst;
  int32_t raw;
  int32_t dom;
  ulong local_180;
  ulong local_178;
  undefined **local_170;
  undefined6 *local_168;
  int32_t doy;
  UnicodeString stdName;
  UnicodeString dstName;
  UnicodeString name;
  UDate nextStart;
  StackBufferOrFields local_88;
  TimeZoneTransition tzt;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  local_198 = (VTimeZone *)basictz;
  writeHeaders(this,w,status);
  if (U_ZERO_ERROR < *status) {
    return;
  }
  local_228 = status;
  if ((customProps != (UVector *)0x0) && (0 < customProps->count)) {
    iVar20 = 0;
    do {
      src = (UnicodeString *)UVector::elementAt(customProps,iVar20);
      sVar1 = (src->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar7 = (src->fUnion).fFields.fLength;
      }
      else {
        iVar7 = (int)sVar1 >> 5;
      }
      UnicodeString::doAppend(w->out,src,0,iVar7);
      UnicodeString::doAppend(w->out,L"\r\n",0,-1);
      local_168 = &ICAL_NEWLINE;
      iVar20 = iVar20 + 1;
    } while (iVar20 < customProps->count);
  }
  dstName.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b5258;
  dstName.fUnion.fStackFields.fLengthAndFlags = 2;
  stdName.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b5258;
  stdName.fUnion.fStackFields.fLengthAndFlags = 2;
  TimeZoneTransition::TimeZoneTransition(&tzt);
  local_170 = &PTR__UnicodeString_003b5258;
  name.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b5258;
  name.fUnion.fStackFields.fLengthAndFlags = 2;
  local_1a8 = 0x7fffffff;
  local_1b0 = -1.84303902528e+17;
  local_208 = 0.0;
  local_1b8 = 0.0;
  local_210 = 0.0;
  local_1c0 = 0.0;
  local_1d8 = 0;
  local_1a0 = 0;
  local_1f8 = 0;
  local_238 = (VTimeZone *)0x0;
  local_260 = 0;
  local_220 = 0;
  local_248 = 0;
  local_180 = 0;
  local_1e0 = 0;
  local_1e8 = 0;
  local_1f0 = 0;
  local_1a4 = 0;
  local_200 = 0;
  local_240 = (VTimeZone *)0x0;
  local_1d0 = 0;
  local_1c8 = 0;
  local_178 = 0;
  local_244 = 0;
  local_21c = 0;
  local_25c = 0;
  bVar3 = false;
  do {
    bVar4 = bVar3;
    this_00 = local_198;
    iVar20 = (*(((TimeZoneRule *)&local_198->super_BasicTimeZone)->super_UObject)._vptr_UObject[0xe]
             )(local_1b0,local_198,0,(VTimeZone *)&tzt);
    if ((char)iVar20 == '\0') goto LAB_0020587f;
    local_1b0 = TimeZoneTransition::getTime(&tzt);
    pTVar14 = TimeZoneTransition::getTo(&tzt);
    TimeZoneRule::getName(pTVar14,&name);
    pTVar14 = TimeZoneTransition::getTo(&tzt);
    iVar7 = TimeZoneRule::getDSTSavings(pTVar14);
    pTVar14 = TimeZoneTransition::getFrom(&tzt);
    iVar8 = TimeZoneRule::getRawOffset(pTVar14);
    pTVar14 = TimeZoneTransition::getFrom(&tzt);
    iVar9 = TimeZoneRule::getDSTSavings(pTVar14);
    pTVar14 = TimeZoneTransition::getFrom(&tzt);
    local_19c = TimeZoneRule::getDSTSavings(pTVar14);
    pTVar14 = TimeZoneTransition::getTo(&tzt);
    iVar10 = TimeZoneRule::getRawOffset(pTVar14);
    pTVar14 = TimeZoneTransition::getTo(&tzt);
    iVar11 = TimeZoneRule::getDSTSavings(pTVar14);
    UVar23 = TimeZoneTransition::getTime(&tzt);
    iVar22 = iVar9 + iVar8;
    Grego::timeToFields(UVar23 + (double)iVar22,&year,&month,&dom,&dow,&doy,&mid);
    this_00 = (VTimeZone *)(ulong)(uint)year;
    uVar12 = Grego::dayOfWeekInMonth(year,month,dom);
    iVar20 = iVar11 + iVar10;
    if (iVar7 == 0) {
      if (local_240 == (VTimeZone *)0x0) {
        this_00 = (VTimeZone *)&tzt;
        pVVar15 = (VTimeZone *)TimeZoneTransition::getTo(&tzt);
        if (pVVar15 == (VTimeZone *)0x0) {
          pVVar16 = (VTimeZone *)0x0;
        }
        else {
          pVVar16 = (VTimeZone *)
                    __dynamic_cast(pVVar15,&TimeZoneRule::typeinfo,&AnnualTimeZoneRule::typeinfo,0);
          this_00 = pVVar15;
        }
        if ((pVVar16 == (VTimeZone *)0x0) ||
           (iVar7 = AnnualTimeZoneRule::getEndYear((AnnualTimeZoneRule *)pVVar16), this_00 = pVVar16
           , iVar7 != local_1a8)) {
          local_240 = (VTimeZone *)0x0;
        }
        else {
          this_00 = (VTimeZone *)TimeZoneTransition::getTo(&tzt);
          iVar13 = (*(((TimeZoneRule *)&this_00->super_BasicTimeZone)->super_UObject)._vptr_UObject
                     [3])();
          local_240 = (VTimeZone *)CONCAT44(extraout_var_00,iVar13);
        }
      }
      if ((int)local_200 < 1) {
LAB_002057c9:
        bVar3 = true;
      }
      else {
        bVar3 = true;
        if (year == (int)local_200 + (int)local_180) {
          if ((stdName.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
            uVar18 = stdName.fUnion.fFields.fLength;
            if (-1 < stdName.fUnion.fStackFields.fLengthAndFlags) {
              uVar18 = (int)stdName.fUnion.fStackFields.fLengthAndFlags >> 5;
            }
            iVar13 = 0;
            if ((int)uVar18 < 0) {
              iVar13 = uVar18;
            }
            iVar21 = uVar18 - iVar13;
            if ((int)uVar18 <= uVar18 - iVar13) {
              iVar21 = uVar18;
            }
            if ((int)uVar18 < 0) {
              iVar21 = 0;
            }
            uVar18 = name.fUnion.fFields.fLength;
            if (-1 < name.fUnion.fStackFields.fLengthAndFlags) {
              uVar18 = (int)name.fUnion.fStackFields.fLengthAndFlags >> 5;
            }
            uVar19 = stdName.fUnion.fStackFields.fBuffer;
            if ((stdName.fUnion.fStackFields.fLengthAndFlags & 2U) == 0) {
              uVar19 = stdName.fUnion.fFields.fArray;
            }
            this_00 = (VTimeZone *)&name;
            bVar5 = UnicodeString::doCompare
                              ((UnicodeString *)this_00,0,uVar18,(UChar *)uVar19,iVar13,iVar21);
          }
          else {
            bVar5 = ~(byte)name.fUnion.fStackFields.fLengthAndFlags & 1;
          }
          if (((((bVar5 == 0) && (local_260 == iVar22)) && (local_248 == iVar20)) &&
              (((int)local_1e0 == month && ((int)local_1e8 == dow)))) &&
             (((uint)local_1f0 == uVar12 && (local_1a4 == mid)))) {
            local_200 = (ulong)((int)local_200 + 1);
            bVar3 = false;
            local_1c0 = local_1b0;
          }
        }
        if (bVar3) {
          if ((int)local_200 == 1) {
            this_00 = this;
            writeZonePropsByTime
                      (this,w,'\0',&stdName,local_260,local_248,local_210,'\x01',local_228);
          }
          else {
            this_00 = this;
            writeZonePropsByDOW(this,w,'\0',&stdName,local_260,local_248,(int32_t)local_1e0,
                                (int32_t)local_1f0,(int32_t)local_1e8,local_210,local_1c0,local_228)
            ;
          }
          iVar13 = 7;
          if (U_ZERO_ERROR < *local_228) goto LAB_0020586c;
          goto LAB_002057c9;
        }
        bVar3 = false;
      }
      if (bVar3) {
        this_00 = (VTimeZone *)&stdName;
        UnicodeString::operator=((UnicodeString *)this_00,&name);
        local_180 = (ulong)(uint)year;
        local_1e0 = (ulong)(uint)month;
        local_1e8 = (ulong)(uint)dow;
        local_200 = 1;
        local_1a4 = mid;
        local_220 = local_19c;
        local_1f0 = (ulong)uVar12;
        local_210 = local_1b0;
        local_1c0 = local_1b0;
        local_260 = iVar22;
        local_248 = iVar20;
      }
LAB_00205855:
      if ((local_240 == (VTimeZone *)0x0) || (iVar13 = 6, local_238 == (VTimeZone *)0x0)) {
        iVar13 = 0;
      }
    }
    else {
      if (local_238 == (VTimeZone *)0x0) {
        this_00 = (VTimeZone *)&tzt;
        pVVar15 = (VTimeZone *)TimeZoneTransition::getTo(&tzt);
        if (pVVar15 == (VTimeZone *)0x0) {
          pVVar16 = (VTimeZone *)0x0;
        }
        else {
          pVVar16 = (VTimeZone *)
                    __dynamic_cast(pVVar15,&TimeZoneRule::typeinfo,&AnnualTimeZoneRule::typeinfo,0);
          this_00 = pVVar15;
        }
        if ((pVVar16 == (VTimeZone *)0x0) ||
           (iVar7 = AnnualTimeZoneRule::getEndYear((AnnualTimeZoneRule *)pVVar16), this_00 = pVVar16
           , iVar7 != local_1a8)) {
          local_238 = (VTimeZone *)0x0;
        }
        else {
          this_00 = (VTimeZone *)TimeZoneTransition::getTo(&tzt);
          iVar13 = (*(((TimeZoneRule *)&this_00->super_BasicTimeZone)->super_UObject)._vptr_UObject
                     [3])();
          local_238 = (VTimeZone *)CONCAT44(extraout_var,iVar13);
        }
      }
      if ((int)local_1f8 < 1) {
LAB_002055ca:
        bVar3 = true;
LAB_002055cc:
        if (bVar3) {
          this_00 = (VTimeZone *)&dstName;
          UnicodeString::operator=((UnicodeString *)this_00,&name);
          local_178 = (ulong)(uint)year;
          local_1c8 = (ulong)(uint)month;
          local_1d0 = (ulong)(uint)dow;
          local_1f8 = 1;
          local_1a0 = mid;
          local_1d8 = (ulong)uVar12;
          local_208 = local_1b0;
          local_1b8 = local_1b0;
          local_21c = local_19c;
          local_25c = iVar22;
          local_244 = iVar20;
        }
        goto LAB_00205855;
      }
      bVar3 = true;
      if (year == (int)local_1f8 + (int)local_178) {
        if ((dstName.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
          uVar18 = dstName.fUnion.fFields.fLength;
          if (-1 < dstName.fUnion.fStackFields.fLengthAndFlags) {
            uVar18 = (int)dstName.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          iVar13 = 0;
          if ((int)uVar18 < 0) {
            iVar13 = uVar18;
          }
          iVar21 = uVar18 - iVar13;
          if ((int)uVar18 <= uVar18 - iVar13) {
            iVar21 = uVar18;
          }
          if ((int)uVar18 < 0) {
            iVar21 = 0;
          }
          uVar18 = name.fUnion.fFields.fLength;
          if (-1 < name.fUnion.fStackFields.fLengthAndFlags) {
            uVar18 = (int)name.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          uVar19 = dstName.fUnion.fStackFields.fBuffer;
          if ((dstName.fUnion.fStackFields.fLengthAndFlags & 2U) == 0) {
            uVar19 = dstName.fUnion.fFields.fArray;
          }
          this_00 = (VTimeZone *)&name;
          bVar5 = UnicodeString::doCompare
                            ((UnicodeString *)this_00,0,uVar18,(UChar *)uVar19,iVar13,iVar21);
        }
        else {
          bVar5 = ~(byte)name.fUnion.fStackFields.fLengthAndFlags & 1;
        }
        if ((((bVar5 == 0) && (local_25c == iVar22)) && (local_244 == iVar20)) &&
           ((((int)local_1c8 == month && ((int)local_1d0 == dow)) &&
            (((uint)local_1d8 == uVar12 && (local_1a0 == mid)))))) {
          local_1f8 = (ulong)((int)local_1f8 + 1);
          bVar3 = false;
          local_1b8 = local_1b0;
        }
      }
      if (!bVar3) {
        bVar3 = false;
        goto LAB_002055cc;
      }
      if ((int)local_1f8 == 1) {
        this_00 = this;
        writeZonePropsByTime(this,w,'\x01',&dstName,local_25c,local_244,local_208,'\x01',local_228);
      }
      else {
        this_00 = this;
        writeZonePropsByDOW(this,w,'\x01',&dstName,local_25c,local_244,(int32_t)local_1c8,
                            (int32_t)local_1d8,(int32_t)local_1d0,local_208,local_1b8,local_228);
      }
      iVar13 = 7;
      if (*local_228 < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_002055ca;
    }
LAB_0020586c:
    bVar4 = true;
    bVar3 = true;
  } while (iVar13 == 0);
  if (iVar13 == 7) goto LAB_00205d46;
LAB_0020587f:
  status_00 = local_228;
  if (bVar4) {
    if (0 < (int)local_1f8) {
      if (local_238 == (VTimeZone *)0x0) {
        if ((int)local_1f8 == 1) {
          this_00 = this;
          writeZonePropsByTime
                    (this,w,'\x01',&dstName,local_25c,local_244,local_208,'\x01',local_228);
        }
        else {
          this_00 = this;
          writeZonePropsByDOW(this,w,'\x01',&dstName,local_25c,local_244,(int32_t)local_1c8,
                              (int32_t)local_1d8,(int32_t)local_1d0,local_208,local_1b8,local_228);
        }
        if (U_ZERO_ERROR < *status_00) {
          local_238 = (VTimeZone *)0x0;
          goto LAB_00205d46;
        }
      }
      else {
        if ((int)local_1f8 == 1) {
          this_00 = this;
          writeFinalRule(this,w,'\x01',(AnnualTimeZoneRule *)local_238,local_25c - local_21c,
                         local_21c,local_208,local_228);
        }
        else {
          pDVar17 = AnnualTimeZoneRule::getRule((AnnualTimeZoneRule *)local_238);
          UVar6 = isEquivalentDateRule
                            ((int32_t)local_1c8,(int32_t)local_1d8,(int32_t)local_1d0,pDVar17);
          if (UVar6 == '\0') {
            writeZonePropsByDOW(this,w,'\x01',&dstName,local_25c,local_244,(int32_t)local_1c8,
                                (int32_t)local_1d8,(int32_t)local_1d0,local_208,local_1b8,status_00)
            ;
            if (U_ZERO_ERROR < *status_00) goto LAB_00205d46;
            local_25c = local_25c - local_21c;
            this_00 = local_238;
            iVar20 = (*(local_238->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject
                       [9])(local_1b8);
            if ((char)iVar20 != '\0') {
              this_00 = this;
              writeFinalRule(this,w,'\x01',(AnnualTimeZoneRule *)local_238,local_25c,local_21c,
                             nextStart,status_00);
            }
          }
          else {
            this_00 = this;
            writeZonePropsByDOW(this,w,'\x01',&dstName,local_25c,local_244,(int32_t)local_1c8,
                                (int32_t)local_1d8,(int32_t)local_1d0,local_208,1.838821689216e+17,
                                status_00);
          }
        }
        if (U_ZERO_ERROR < *status_00) goto LAB_00205d46;
      }
    }
    if (0 < (int)local_200) {
      if (local_240 != (VTimeZone *)0x0) {
        if ((int)local_200 == 1) {
          writeFinalRule(this,w,'\0',(AnnualTimeZoneRule *)local_240,local_260 - local_220,local_220
                         ,local_210,status_00);
          this_00 = this;
        }
        else {
          pDVar17 = AnnualTimeZoneRule::getRule((AnnualTimeZoneRule *)local_240);
          UVar6 = isEquivalentDateRule
                            ((int32_t)local_1e0,(int32_t)local_1f0,(int32_t)local_1e8,pDVar17);
          if (UVar6 == '\0') {
            writeZonePropsByDOW(this,w,'\0',&stdName,local_260,local_248,(int32_t)local_1e0,
                                (int32_t)local_1f0,(int32_t)local_1e8,local_210,local_1c0,status_00)
            ;
            if (U_ZERO_ERROR < *status_00) goto LAB_00205d46;
            local_260 = local_260 - local_220;
            this_00 = local_240;
            iVar20 = (*(local_240->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject
                       [9])(local_1c0);
            if ((char)iVar20 != '\0') {
              writeFinalRule(this,w,'\0',(AnnualTimeZoneRule *)local_240,local_260,local_220,
                             nextStart,status_00);
              this_00 = this;
            }
          }
          else {
            writeZonePropsByDOW(this,w,'\0',&stdName,local_260,local_248,(int32_t)local_1e0,
                                (int32_t)local_1f0,(int32_t)local_1e8,local_210,1.838821689216e+17,
                                status_00);
            this_00 = this;
          }
        }
        UVar2 = *status_00;
        goto joined_r0x002059c7;
      }
      if ((int)local_200 == 1) {
        writeZonePropsByTime(this,w,'\0',&stdName,local_260,local_248,local_210,'\x01',status_00);
        this_00 = this;
      }
      else {
        writeZonePropsByDOW(this,w,'\0',&stdName,local_260,local_248,(int32_t)local_1e0,
                            (int32_t)local_1f0,(int32_t)local_1e8,local_210,local_1c0,status_00);
        this_00 = this;
      }
      if (U_ZERO_ERROR < *status_00) {
        local_240 = (VTimeZone *)0x0;
        goto LAB_00205d46;
      }
    }
  }
  else {
    (*(((TimeZoneRule *)&local_198->super_BasicTimeZone)->super_UObject)._vptr_UObject[6])
              (0,local_198,0,&raw,&dst,local_228);
    if (U_ZERO_ERROR < *status_00) goto LAB_00205d46;
    iVar20 = raw + dst;
    nextStart = (UDate)local_170;
    local_88.fStackFields.fLengthAndFlags = L'\x02';
    UnicodeString::operator=
              ((UnicodeString *)&nextStart,&((TimeZoneRule *)&local_198->super_BasicTimeZone)->fName
              );
    getDefaultTZName((UnicodeString *)&nextStart,dst != 0,&name);
    writeZonePropsByTime(this,w,dst != 0,&name,iVar20,iVar20,0.0 - (double)iVar20,'\0',local_228);
    status_00 = local_228;
    UVar2 = *local_228;
    this_00 = (VTimeZone *)&nextStart;
    UnicodeString::~UnicodeString((UnicodeString *)this_00);
joined_r0x002059c7:
    if (U_ZERO_ERROR < UVar2) goto LAB_00205d46;
  }
  writeFooter(this_00,w,status_00);
LAB_00205d46:
  if (local_240 != (VTimeZone *)0x0) {
    (*(local_240->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[1])();
  }
  if (local_238 != (VTimeZone *)0x0) {
    (*(local_238->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[1])();
  }
  UnicodeString::~UnicodeString(&name);
  TimeZoneTransition::~TimeZoneTransition(&tzt);
  UnicodeString::~UnicodeString(&stdName);
  UnicodeString::~UnicodeString(&dstName);
  return;
}

Assistant:

void
VTimeZone::writeZone(VTZWriter& w, BasicTimeZone& basictz,
                     UVector* customProps, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }
    writeHeaders(w, status);
    if (U_FAILURE(status)) {
        return;
    }

    if (customProps != NULL) {
        for (int32_t i = 0; i < customProps->size(); i++) {
            UnicodeString *custprop = (UnicodeString*)customProps->elementAt(i);
            w.write(*custprop);
            w.write(ICAL_NEWLINE);
        }
    }

    UDate t = MIN_MILLIS;
    UnicodeString dstName;
    int32_t dstFromOffset = 0;
    int32_t dstFromDSTSavings = 0;
    int32_t dstToOffset = 0;
    int32_t dstStartYear = 0;
    int32_t dstMonth = 0;
    int32_t dstDayOfWeek = 0;
    int32_t dstWeekInMonth = 0;
    int32_t dstMillisInDay = 0;
    UDate dstStartTime = 0.0;
    UDate dstUntilTime = 0.0;
    int32_t dstCount = 0;
    AnnualTimeZoneRule *finalDstRule = NULL;

    UnicodeString stdName;
    int32_t stdFromOffset = 0;
    int32_t stdFromDSTSavings = 0;
    int32_t stdToOffset = 0;
    int32_t stdStartYear = 0;
    int32_t stdMonth = 0;
    int32_t stdDayOfWeek = 0;
    int32_t stdWeekInMonth = 0;
    int32_t stdMillisInDay = 0;
    UDate stdStartTime = 0.0;
    UDate stdUntilTime = 0.0;
    int32_t stdCount = 0;
    AnnualTimeZoneRule *finalStdRule = NULL;

    int32_t year, month, dom, dow, doy, mid;
    UBool hasTransitions = FALSE;
    TimeZoneTransition tzt;
    UBool tztAvail;
    UnicodeString name;
    UBool isDst;

    // Going through all transitions
    while (TRUE) {
        tztAvail = basictz.getNextTransition(t, FALSE, tzt);
        if (!tztAvail) {
            break;
        }
        hasTransitions = TRUE;
        t = tzt.getTime();
        tzt.getTo()->getName(name);
        isDst = (tzt.getTo()->getDSTSavings() != 0);
        int32_t fromOffset = tzt.getFrom()->getRawOffset() + tzt.getFrom()->getDSTSavings();
        int32_t fromDSTSavings = tzt.getFrom()->getDSTSavings();
        int32_t toOffset = tzt.getTo()->getRawOffset() + tzt.getTo()->getDSTSavings();
        Grego::timeToFields(tzt.getTime() + fromOffset, year, month, dom, dow, doy, mid);
        int32_t weekInMonth = Grego::dayOfWeekInMonth(year, month, dom);
        UBool sameRule = FALSE;
        const AnnualTimeZoneRule *atzrule;
        if (isDst) {
            if (finalDstRule == NULL
                && (atzrule = dynamic_cast<const AnnualTimeZoneRule *>(tzt.getTo())) != NULL
                && atzrule->getEndYear() == AnnualTimeZoneRule::MAX_YEAR
            ) {
                finalDstRule = (AnnualTimeZoneRule*)tzt.getTo()->clone();
            }
            if (dstCount > 0) {
                if (year == dstStartYear + dstCount
                        && name.compare(dstName) == 0
                        && dstFromOffset == fromOffset
                        && dstToOffset == toOffset
                        && dstMonth == month
                        && dstDayOfWeek == dow
                        && dstWeekInMonth == weekInMonth
                        && dstMillisInDay == mid) {
                    // Update until time
                    dstUntilTime = t;
                    dstCount++;
                    sameRule = TRUE;
                }
                if (!sameRule) {
                    if (dstCount == 1) {
                        writeZonePropsByTime(w, TRUE, dstName, dstFromOffset, dstToOffset, dstStartTime,
                                TRUE, status);
                    } else {
                        writeZonePropsByDOW(w, TRUE, dstName, dstFromOffset, dstToOffset,
                                dstMonth, dstWeekInMonth, dstDayOfWeek, dstStartTime, dstUntilTime, status);
                    }
                    if (U_FAILURE(status)) {
                        goto cleanupWriteZone;
                    }
                }
            } 
            if (!sameRule) {
                // Reset this DST information
                dstName = name;
                dstFromOffset = fromOffset;
                dstFromDSTSavings = fromDSTSavings;
                dstToOffset = toOffset;
                dstStartYear = year;
                dstMonth = month;
                dstDayOfWeek = dow;
                dstWeekInMonth = weekInMonth;
                dstMillisInDay = mid;
                dstStartTime = dstUntilTime = t;
                dstCount = 1;
            }
            if (finalStdRule != NULL && finalDstRule != NULL) {
                break;
            }
        } else {
            if (finalStdRule == NULL
                && (atzrule = dynamic_cast<const AnnualTimeZoneRule *>(tzt.getTo())) != NULL
                && atzrule->getEndYear() == AnnualTimeZoneRule::MAX_YEAR
            ) {
                finalStdRule = (AnnualTimeZoneRule*)tzt.getTo()->clone();
            }
            if (stdCount > 0) {
                if (year == stdStartYear + stdCount
                        && name.compare(stdName) == 0
                        && stdFromOffset == fromOffset
                        && stdToOffset == toOffset
                        && stdMonth == month
                        && stdDayOfWeek == dow
                        && stdWeekInMonth == weekInMonth
                        && stdMillisInDay == mid) {
                    // Update until time
                    stdUntilTime = t;
                    stdCount++;
                    sameRule = TRUE;
                }
                if (!sameRule) {
                    if (stdCount == 1) {
                        writeZonePropsByTime(w, FALSE, stdName, stdFromOffset, stdToOffset, stdStartTime,
                                TRUE, status);
                    } else {
                        writeZonePropsByDOW(w, FALSE, stdName, stdFromOffset, stdToOffset,
                                stdMonth, stdWeekInMonth, stdDayOfWeek, stdStartTime, stdUntilTime, status);
                    }
                    if (U_FAILURE(status)) {
                        goto cleanupWriteZone;
                    }
                }
            }
            if (!sameRule) {
                // Reset this STD information
                stdName = name;
                stdFromOffset = fromOffset;
                stdFromDSTSavings = fromDSTSavings;
                stdToOffset = toOffset;
                stdStartYear = year;
                stdMonth = month;
                stdDayOfWeek = dow;
                stdWeekInMonth = weekInMonth;
                stdMillisInDay = mid;
                stdStartTime = stdUntilTime = t;
                stdCount = 1;
            }
            if (finalStdRule != NULL && finalDstRule != NULL) {
                break;
            }
        }
    }
    if (!hasTransitions) {
        // No transition - put a single non transition RDATE
        int32_t raw, dst, offset;
        basictz.getOffset(0.0/*any time*/, FALSE, raw, dst, status);
        if (U_FAILURE(status)) {
            goto cleanupWriteZone;
        }
        offset = raw + dst;
        isDst = (dst != 0);
        UnicodeString tzid;
        basictz.getID(tzid);
        getDefaultTZName(tzid, isDst, name);        
        writeZonePropsByTime(w, isDst, name,
                offset, offset, DEF_TZSTARTTIME - offset, FALSE, status);    
        if (U_FAILURE(status)) {
            goto cleanupWriteZone;
        }
    } else {
        if (dstCount > 0) {
            if (finalDstRule == NULL) {
                if (dstCount == 1) {
                    writeZonePropsByTime(w, TRUE, dstName, dstFromOffset, dstToOffset, dstStartTime,
                            TRUE, status);
                } else {
                    writeZonePropsByDOW(w, TRUE, dstName, dstFromOffset, dstToOffset,
                            dstMonth, dstWeekInMonth, dstDayOfWeek, dstStartTime, dstUntilTime, status);
                }
                if (U_FAILURE(status)) {
                    goto cleanupWriteZone;
                }
            } else {
                if (dstCount == 1) {
                    writeFinalRule(w, TRUE, finalDstRule,
                            dstFromOffset - dstFromDSTSavings, dstFromDSTSavings, dstStartTime, status);
                } else {
                    // Use a single rule if possible
                    if (isEquivalentDateRule(dstMonth, dstWeekInMonth, dstDayOfWeek, finalDstRule->getRule())) {
                        writeZonePropsByDOW(w, TRUE, dstName, dstFromOffset, dstToOffset,
                                dstMonth, dstWeekInMonth, dstDayOfWeek, dstStartTime, MAX_MILLIS, status);
                    } else {
                        // Not equivalent rule - write out two different rules
                        writeZonePropsByDOW(w, TRUE, dstName, dstFromOffset, dstToOffset,
                                dstMonth, dstWeekInMonth, dstDayOfWeek, dstStartTime, dstUntilTime, status);
                        if (U_FAILURE(status)) {
                            goto cleanupWriteZone;
                        }
                        UDate nextStart;
                        UBool nextStartAvail = finalDstRule->getNextStart(dstUntilTime, dstFromOffset - dstFromDSTSavings, dstFromDSTSavings, false, nextStart);
                        U_ASSERT(nextStartAvail);
                        if (nextStartAvail) {
                            writeFinalRule(w, TRUE, finalDstRule,
                                    dstFromOffset - dstFromDSTSavings, dstFromDSTSavings, nextStart, status);
                        }
                    }
                }
                if (U_FAILURE(status)) {
                    goto cleanupWriteZone;
                }
            }
        }
        if (stdCount > 0) {
            if (finalStdRule == NULL) {
                if (stdCount == 1) {
                    writeZonePropsByTime(w, FALSE, stdName, stdFromOffset, stdToOffset, stdStartTime,
                            TRUE, status);
                } else {
                    writeZonePropsByDOW(w, FALSE, stdName, stdFromOffset, stdToOffset,
                            stdMonth, stdWeekInMonth, stdDayOfWeek, stdStartTime, stdUntilTime, status);
                }
                if (U_FAILURE(status)) {
                    goto cleanupWriteZone;
                }
            } else {
                if (stdCount == 1) {
                    writeFinalRule(w, FALSE, finalStdRule,
                            stdFromOffset - stdFromDSTSavings, stdFromDSTSavings, stdStartTime, status);
                } else {
                    // Use a single rule if possible
                    if (isEquivalentDateRule(stdMonth, stdWeekInMonth, stdDayOfWeek, finalStdRule->getRule())) {
                        writeZonePropsByDOW(w, FALSE, stdName, stdFromOffset, stdToOffset,
                                stdMonth, stdWeekInMonth, stdDayOfWeek, stdStartTime, MAX_MILLIS, status);
                    } else {
                        // Not equivalent rule - write out two different rules
                        writeZonePropsByDOW(w, FALSE, stdName, stdFromOffset, stdToOffset,
                                stdMonth, stdWeekInMonth, stdDayOfWeek, stdStartTime, stdUntilTime, status);
                        if (U_FAILURE(status)) {
                            goto cleanupWriteZone;
                        }
                        UDate nextStart;
                        UBool nextStartAvail = finalStdRule->getNextStart(stdUntilTime, stdFromOffset - stdFromDSTSavings, stdFromDSTSavings, false, nextStart);
                        U_ASSERT(nextStartAvail);
                        if (nextStartAvail) {
                            writeFinalRule(w, FALSE, finalStdRule,
                                    stdFromOffset - stdFromDSTSavings, stdFromDSTSavings, nextStart, status);
                        }
                    }
                }
                if (U_FAILURE(status)) {
                    goto cleanupWriteZone;
                }
            }
        }            
    }
    writeFooter(w, status);

cleanupWriteZone:

    if (finalStdRule != NULL) {
        delete finalStdRule;
    }
    if (finalDstRule != NULL) {
        delete finalDstRule;
    }
}